

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::~SparseMatrix
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *this)

{
  VectorDynSize *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  VectorDynSize::~VectorDynSize(in_RDI);
  return;
}

Assistant:

SparseMatrix<ordering>::~SparseMatrix() {}